

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# form.cpp
# Opt level: O0

void __thiscall cppcms::form::iterator::next(iterator *this)

{
  uint uVar1;
  bool bVar2;
  int iVar3;
  size_type sVar4;
  reference pvVar5;
  undefined4 extraout_var;
  reference pvVar6;
  stack<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_> *this_00;
  iterator *in_RDI;
  value_type *in_stack_ffffffffffffffc8;
  
  while( true ) {
    while( true ) {
      if (in_RDI->current_ == (form *)0x0) {
        return;
      }
      uVar1 = in_RDI->offset_;
      sVar4 = std::
              vector<std::pair<cppcms::base_form_*,_bool>,_std::allocator<std::pair<cppcms::base_form_*,_bool>_>_>
              ::size(&in_RDI->current_->elements_);
      if (uVar1 < sVar4) break;
      bVar2 = std::stack<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>::
              empty((stack<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_> *
                    )0x3f5635);
      if (bVar2) {
        zero(in_RDI);
        return;
      }
      pvVar5 = std::stack<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>::
               top((stack<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                   0x3f5654);
      in_RDI->offset_ = *pvVar5;
      std::stack<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>::pop
                ((stack<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                 0x3f5663);
      iVar3 = (*(in_RDI->current_->super_base_form)._vptr_base_form[5])();
      in_RDI->current_ = (form *)CONCAT44(extraout_var,iVar3);
    }
    pvVar6 = std::
             vector<std::pair<cppcms::base_form_*,_bool>,_std::allocator<std::pair<cppcms::base_form_*,_bool>_>_>
             ::operator[](&in_RDI->current_->elements_,(ulong)in_RDI->offset_);
    if (pvVar6->first == (base_form *)0x0) {
      this_00 = (stack<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_> *)0x0
      ;
    }
    else {
      this_00 = (stack<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                __dynamic_cast(pvVar6->first,&base_form::typeinfo,&widgets::base_widget::typeinfo,0)
      ;
    }
    if (this_00 !=
        (stack<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_> *)0x0) break;
    pvVar6 = std::
             vector<std::pair<cppcms::base_form_*,_bool>,_std::allocator<std::pair<cppcms::base_form_*,_bool>_>_>
             ::operator[](&in_RDI->current_->elements_,(ulong)in_RDI->offset_);
    in_RDI->current_ = (form *)pvVar6->first;
    std::stack<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>::push
              (this_00,in_stack_ffffffffffffffc8);
    in_RDI->offset_ = 0;
  }
  in_RDI->offset_ = in_RDI->offset_ + 1;
  return;
}

Assistant:

void form::iterator::next()
{
	for(;;) {
		if(!current_)
			return;
		if(offset_ >=current_->elements_.size()) {
			if(return_positions_.empty()) {
				zero();
				return;
			}
			offset_ = return_positions_.top();
			return_positions_.pop();
			current_ = current_->parent();
		}
		else if(dynamic_cast<widgets::base_widget *>(current_->elements_[offset_].first)!=0) {
			offset_++;
			return;
		}
		else {
			// Elements can be only base_widget or form... so it should be safe
			current_ = static_cast<form *>(current_->elements_[offset_].first);
			return_positions_.push(offset_+1);
			offset_=0;
		}
	}
}